

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O3

MessageLevel cmInstallGenerator::SelectMessageLevel(cmMakefile *mf,bool never)

{
  int iVar1;
  char *pcVar2;
  MessageLevel MVar3;
  undefined7 in_register_00000031;
  string m;
  allocator local_59;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  MVar3 = MessageNever;
  if ((int)CONCAT71(in_register_00000031,never) == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_INSTALL_MESSAGE","");
    pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_58);
    std::__cxx11::string::string((string *)local_38,pcVar2,&local_59);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    iVar1 = std::__cxx11::string::compare((char *)local_38);
    if (iVar1 == 0) {
      MVar3 = MessageAlways;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_38);
      if (iVar1 == 0) {
        MVar3 = MessageLazy;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_38);
        MVar3 = (uint)(iVar1 == 0) * 3;
      }
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return MVar3;
}

Assistant:

cmInstallGenerator::MessageLevel cmInstallGenerator::SelectMessageLevel(
  cmMakefile* mf, bool never)
{
  if (never) {
    return MessageNever;
  }
  std::string m = mf->GetSafeDefinition("CMAKE_INSTALL_MESSAGE");
  if (m == "ALWAYS") {
    return MessageAlways;
  }
  if (m == "LAZY") {
    return MessageLazy;
  }
  if (m == "NEVER") {
    return MessageNever;
  }
  return MessageDefault;
}